

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeColumns(ImGuiOldColumns *columns)

{
  float offset_norm;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  float fVar4;
  
  bVar1 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (void *)(ulong)columns->ID,(ulong)(uint)columns->Count,
                   (ulong)(uint)columns->Flags);
  if (bVar1) {
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",(double)(columns->OffMaxX - columns->OffMinX),
               (double)columns->OffMinX,(double)columns->OffMaxX);
    if (0 < (columns->Columns).Size) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        offset_norm = *(float *)((long)&((columns->Columns).Data)->OffsetNorm + lVar2);
        fVar4 = GetColumnOffsetFromNorm(columns,offset_norm);
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)offset_norm,(double)fVar4,
                   uVar3 & 0xffffffff);
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x1c;
      } while ((long)uVar3 < (long)(columns->Columns).Size);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeColumns(ImGuiOldColumns* columns)
{
    if (!TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
        return;
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
    for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
        BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
    TreePop();
}